

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

Gia_Man_t * Gia_ManDupUnnormalize(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iLit1;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  int *piVar5;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar6;
  int i;
  
  if (p->nBufs != 0) {
    __assert_fail("!Gia_ManBufNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x184,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
  }
  p_00 = Gia_ManOrderWithBoxes(p);
  if (p_00 == (Vec_Int_t *)0x0) {
    p_01 = (Gia_Man_t *)0x0;
  }
  else {
    Gia_ManFillValue(p);
    p_01 = Gia_ManStart(p->nObjs);
    pcVar4 = Abc_UtilStrsav(p->pName);
    p_01->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(p->pSpec);
    p_01->pSpec = pcVar4;
    if (p->pSibls != (int *)0x0) {
      piVar5 = (int *)calloc((long)p->nObjs,4);
      p_01->pSibls = piVar5;
    }
    for (i = 0; i < p_00->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(p_00,i);
      pObj = Gia_ManObj(p,iVar2);
      if (pObj == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjIsBuf(pObj);
      if (iVar2 == 0) {
        uVar1 = *(ulong *)pObj;
        uVar3 = (uint)uVar1;
        if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar3 < 0) {
          if ((~uVar3 & 0x9fffffff) == 0) {
            uVar3 = Gia_ManAppendCi(p_01);
          }
          else {
            if (-1 < (int)uVar3 || (int)(uVar1 & 0x1fffffff) == 0x1fffffff) {
              if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                              ,0x19e,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
              }
              pObj->Value = 0;
              goto LAB_0020bdeb;
            }
            iVar2 = Gia_ObjFanin0Copy(pObj);
            uVar3 = Gia_ManAppendCo(p_01,iVar2);
          }
          goto LAB_0020bde6;
        }
        iVar2 = Gia_ObjFanin0Copy(pObj);
        iLit1 = Gia_ObjFanin1Copy(pObj);
        uVar3 = Gia_ManAppendAnd(p_01,iVar2,iLit1);
        pObj->Value = uVar3;
        iVar2 = Gia_ObjId(p,pObj);
        if ((p->pSibls != (int *)0x0) && (p->pSibls[iVar2] != 0)) {
          iVar2 = Gia_ObjId(p,pObj);
          pGVar6 = Gia_ObjSiblObj(p,iVar2);
          iVar2 = Abc_Lit2Var(pGVar6->Value);
          piVar5 = p_01->pSibls;
          uVar3 = Abc_Lit2Var(pObj->Value);
          piVar5[uVar3] = iVar2;
        }
      }
      else {
        iVar2 = Gia_ObjFanin0Copy(pObj);
        uVar3 = Gia_ManAppendBuf(p_01,iVar2);
LAB_0020bde6:
        pObj->Value = uVar3;
      }
LAB_0020bdeb:
    }
    Gia_ManSetRegNum(p_01,p->nRegs);
    Vec_IntFree(p_00);
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupUnnormalize( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( !Gia_ManBufNum(p) );
    vNodes = Gia_ManOrderWithBoxes( p );
    if ( vNodes == NULL )
        return NULL;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
                pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsConst0(pObj) )
            pObj->Value = 0;
        else assert( 0 );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vNodes );
    return pNew;
}